

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::IsTrue
          (cmConditionEvaluator *this,
          vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *args,
          string *errorString,MessageType *status)

{
  bool bVar1;
  size_type sVar2;
  reference newArg;
  _List_iterator<cmExpandedCommandArgument> local_90;
  undefined4 local_84;
  _List_node_base *local_80;
  cmExpandedCommandArgument *local_68;
  __normal_iterator<const_cmExpandedCommandArgument_*,_std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>_>
  local_60;
  iterator local_58;
  const_iterator local_50;
  undefined1 local_48 [8];
  cmArgumentList newArgs;
  MessageType *status_local;
  string *errorString_local;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *args_local;
  cmConditionEvaluator *this_local;
  
  newArgs.super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
  _M_impl._M_node._M_size = (size_t)status;
  std::__cxx11::string::operator=((string *)errorString,"");
  sVar2 = std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::size
                    (args);
  if (sVar2 == 0) {
    this_local._7_1_ = false;
  }
  else {
    std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::list
              ((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
               local_48);
    local_58._M_node =
         (_List_node_base *)
         std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
         end((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)local_48
            );
    std::_List_const_iterator<cmExpandedCommandArgument>::_List_const_iterator(&local_50,&local_58);
    local_60._M_current =
         (cmExpandedCommandArgument *)
         std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::begin
                   (args);
    local_68 = (cmExpandedCommandArgument *)
               std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
               end(args);
    local_80 = (_List_node_base *)
               std::__cxx11::
               list<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>::
               insert<__gnu_cxx::__normal_iterator<cmExpandedCommandArgument_const*,std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>>,void>
                         ((list<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>
                           *)local_48,local_50,local_60,
                          (__normal_iterator<const_cmExpandedCommandArgument_*,_std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>_>
                           )local_68);
    bVar1 = HandleLevel0(this,(cmArgumentList *)local_48,errorString,
                         (MessageType *)
                         newArgs.
                         super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                         ._M_impl._M_node._M_size);
    if (bVar1) {
      bVar1 = HandleLevel1(this,(cmArgumentList *)local_48,errorString,
                           (MessageType *)
                           newArgs.
                           super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                           ._M_impl._M_node._M_size);
      if (bVar1) {
        bVar1 = HandleLevel2(this,(cmArgumentList *)local_48,errorString,
                             (MessageType *)
                             newArgs.
                             super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                             ._M_impl._M_node._M_size);
        if (bVar1) {
          bVar1 = HandleLevel3(this,(cmArgumentList *)local_48,errorString,
                               (MessageType *)
                               newArgs.
                               super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                               ._M_impl._M_node._M_size);
          if (bVar1) {
            bVar1 = HandleLevel4(this,(cmArgumentList *)local_48,errorString,
                                 (MessageType *)
                                 newArgs.
                                 super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                                 ._M_impl._M_node._M_size);
            if (bVar1) {
              sVar2 = std::__cxx11::
                      list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                      size((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                            *)local_48);
              if (sVar2 == 1) {
                local_90._M_node =
                     (_List_node_base *)
                     std::__cxx11::
                     list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                     begin((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                            *)local_48);
                newArg = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_90);
                this_local._7_1_ =
                     GetBooleanValueWithAutoDereference
                               (this,newArg,errorString,
                                (MessageType *)
                                newArgs.
                                super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                                ._M_impl._M_node._M_size,true);
              }
              else {
                std::__cxx11::string::operator=((string *)errorString,"Unknown arguments specified")
                ;
                *(undefined4 *)
                 newArgs.
                 super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                 ._M_impl._M_node._M_size = 1;
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
    local_84 = 1;
    std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~list
              ((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
               local_48);
  }
  return this_local._7_1_;
}

Assistant:

bool cmConditionEvaluator::IsTrue(
  const std::vector<cmExpandedCommandArgument> &args,
  std::string &errorString,
  cmake::MessageType &status)
{
  errorString = "";

  // handle empty invocation
  if (args.size() < 1)
    {
    return false;
    }

  // store the reduced args in this vector
  cmArgumentList newArgs;

  // copy to the list structure
  newArgs.insert(newArgs.end(), args.begin(), args.end());

  // now loop through the arguments and see if we can reduce any of them
  // we do this multiple times. Once for each level of precedence
  // parens
  if (!this->HandleLevel0(newArgs, errorString, status))
    {
    return false;
    }
  //predicates
  if (!this->HandleLevel1(newArgs, errorString, status))
    {
    return false;
    }
  // binary ops
  if (!this->HandleLevel2(newArgs, errorString, status))
    {
    return false;
    }

  // NOT
  if (!this->HandleLevel3(newArgs, errorString, status))
    {
    return false;
    }
  // AND OR
  if (!this->HandleLevel4(newArgs, errorString, status))
    {
    return false;
    }

  // now at the end there should only be one argument left
  if (newArgs.size() != 1)
    {
    errorString = "Unknown arguments specified";
    status = cmake::FATAL_ERROR;
    return false;
    }

  return this->GetBooleanValueWithAutoDereference(*(newArgs.begin()),
    errorString, status, true);
}